

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::TextFlow::Column::iterator::iterator(iterator *this,Column *column)

{
  bool bVar1;
  size_type sVar2;
  Column *column_local;
  iterator *this_local;
  
  this->m_column = column;
  this->m_pos = 0;
  this->m_len = 0;
  this->m_end = 0;
  this->m_suffix = false;
  if (this->m_column->m_width <= this->m_column->m_indent) {
    __assert_fail("m_column.m_width > m_column.m_indent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/H-EAL[P]vfs/tests/catch_amalgamated.cpp"
                  ,0x1740,"Catch::TextFlow::Column::iterator::iterator(const Column &)");
  }
  bVar1 = true;
  if (this->m_column->m_initialIndent != 0xffffffffffffffff) {
    bVar1 = this->m_column->m_initialIndent < this->m_column->m_width;
  }
  if (!bVar1) {
    __assert_fail("m_column.m_initialIndent == std::string::npos || m_column.m_width > m_column.m_initialIndent"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/H-EAL[P]vfs/tests/catch_amalgamated.cpp"
                  ,0x1742,"Catch::TextFlow::Column::iterator::iterator(const Column &)");
  }
  calcLength(this);
  if (this->m_len == 0) {
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (&this->m_column->m_string);
    this->m_pos = sVar2;
  }
  return;
}

Assistant:

Column::iterator::iterator(Column const &column) : m_column(column) {
            assert(m_column.m_width > m_column.m_indent);
            assert(m_column.m_initialIndent == std::string::npos ||
                m_column.m_width > m_column.m_initialIndent);
            calcLength();
            if (m_len == 0) {
                m_pos = m_column.m_string.size();
            }
        }